

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateUint32ConstantOperandForDebugInfo
          (ValidationState_t *_,string *operand_name,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  bool bVar1;
  spv_result_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  DiagnosticStream local_200;
  
  bVar1 = IsUint32Constant(_,(inst->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[word_index]);
  sVar2 = SPV_SUCCESS;
  if (!bVar1) {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    if ((ext_inst_name->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*ext_inst_name->_M_invoker)(&local_220,(_Any_data *)ext_inst_name);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,": expected operand ",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,(operand_name->_M_dataplus)._M_p,operand_name->_M_string_length
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200," must be a result id of 32-bit unsigned OpConstant",0x32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    DiagnosticStream::~DiagnosticStream(&local_200);
    sVar2 = local_200.error_;
  }
  return sVar2;
}

Assistant:

spv_result_t ValidateUint32ConstantOperandForDebugInfo(
    ValidationState_t& _, const std::string& operand_name,
    const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name) {
  if (!IsUint32Constant(_, inst->word(word_index))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << ext_inst_name() << ": expected operand " << operand_name
           << " must be a result id of 32-bit unsigned OpConstant";
  }
  return SPV_SUCCESS;
}